

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_rawset(lua_State *L,int idx)

{
  StkId pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *o1;
  TValue *o2;
  StkId t;
  int idx_local;
  lua_State *L_local;
  
  pTVar2 = index2adr(L,idx);
  pTVar1 = L->top;
  pTVar3 = luaH_set(L,&((pTVar2->value).gc)->h,L->top + -2);
  pTVar3->value = pTVar1[-1].value;
  pTVar3->tt = pTVar1[-1].tt;
  if (((3 < L->top[-1].tt) && ((((L->top[-1].value.gc)->gch).marked & 3) != 0)) &&
     (((((pTVar2->value).gc)->gch).marked & 4) != 0)) {
    luaC_barrierback(L,&((pTVar2->value).gc)->h);
  }
  L->top = L->top + -2;
  return;
}

Assistant:

LUA_API void lua_rawset (lua_State *L, int idx) {
  StkId t;
  lua_lock(L);
  api_checknelems(L, 2);
  t = index2adr(L, idx);
  api_check(L, ttistable(t));
  setobj2t(L, luaH_set(L, hvalue(t), L->top-2), L->top-1);
  luaC_barriert(L, hvalue(t), L->top-1);
  L->top -= 2;
  lua_unlock(L);
}